

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O0

OpenMPClause *
OpenMPIfClause::addIfClause
          (OpenMPDirective *directive,OpenMPIfClauseModifier modifier,char *user_defined_modifier)

{
  map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
  *__s;
  bool bVar1;
  OpenMPIfClauseModifier OVar2;
  int iVar3;
  size_type sVar4;
  OpenMPIfClause *pOVar5;
  OpenMPClause *pOVar6;
  mapped_type *ppvVar7;
  reference ppOVar8;
  string local_c8;
  allocator<char> local_a1;
  string local_a0 [32];
  string local_80 [8];
  string current_user_defined_modifier_expression;
  __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
  local_58;
  iterator it;
  OpenMPIfClause *local_40;
  OpenMPClause *new_clause;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *current_clauses;
  map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
  *all_clauses;
  char *user_defined_modifier_local;
  OpenMPDirective *pOStack_18;
  OpenMPIfClauseModifier modifier_local;
  OpenMPDirective *directive_local;
  
  all_clauses = (map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
                 *)user_defined_modifier;
  user_defined_modifier_local._4_4_ = modifier;
  pOStack_18 = directive;
  current_clauses =
       (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)
       OpenMPDirective::getAllClauses(directive);
  new_clause = (OpenMPClause *)OpenMPDirective::getClauses(pOStack_18,OMPC_if);
  local_40 = (OpenMPIfClause *)0x0;
  sVar4 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::size
                    ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause);
  if (sVar4 == 0) {
    pOVar5 = (OpenMPIfClause *)operator_new(0x90);
    OpenMPIfClause(pOVar5,user_defined_modifier_local._4_4_);
    local_40 = pOVar5;
    if (user_defined_modifier_local._4_4_ == OMPC_IF_MODIFIER_user) {
      setUserDefinedModifier(pOVar5,(char *)all_clauses);
    }
    pOVar6 = (OpenMPClause *)operator_new(0x18);
    memset(pOVar6,0,0x18);
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::vector
              ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)pOVar6);
    new_clause = pOVar6;
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back
              ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)pOVar6,
               (value_type *)&local_40);
    pOVar6 = new_clause;
    it._M_current._0_4_ = 0;
    ppvVar7 = std::
              map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
              ::operator[]((map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
                            *)current_clauses,(key_type *)&it);
    *ppvVar7 = (mapped_type)pOVar6;
  }
  else {
    local_58._M_current =
         (OpenMPClause **)
         std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::begin
                   ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause);
    while( true ) {
      current_user_defined_modifier_expression.field_2._8_8_ =
           std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::end
                     ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause);
      bVar1 = __gnu_cxx::operator!=
                        (&local_58,
                         (__normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
                          *)((long)&current_user_defined_modifier_expression.field_2 + 8));
      if (!bVar1) break;
      std::__cxx11::string::string(local_80);
      __s = all_clauses;
      if (all_clauses !=
          (map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
           *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_a0,(char *)__s,&local_a1);
        std::__cxx11::string::operator=(local_80,local_a0);
        std::__cxx11::string::~string(local_a0);
        std::allocator<char>::~allocator(&local_a1);
      }
      ppOVar8 = __gnu_cxx::
                __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
                ::operator*(&local_58);
      OVar2 = getModifier((OpenMPIfClause *)*ppOVar8);
      bVar1 = false;
      if (OVar2 == user_defined_modifier_local._4_4_) {
        ppOVar8 = __gnu_cxx::
                  __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
                  ::operator*(&local_58);
        getUserDefinedModifier_abi_cxx11_(&local_c8,(OpenMPIfClause *)*ppOVar8);
        iVar3 = std::__cxx11::string::compare(local_80);
        bVar1 = iVar3 == 0;
        std::__cxx11::string::~string((string *)&local_c8);
      }
      if (bVar1) {
        ppOVar8 = __gnu_cxx::
                  __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
                  ::operator*(&local_58);
        local_40 = (OpenMPIfClause *)*ppOVar8;
        directive_local = (OpenMPDirective *)local_40;
      }
      std::__cxx11::string::~string(local_80);
      if (bVar1) {
        return (OpenMPClause *)directive_local;
      }
      __gnu_cxx::
      __normal_iterator<OpenMPClause_**,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_>
      ::operator++(&local_58);
    }
    pOVar5 = (OpenMPIfClause *)operator_new(0x90);
    OpenMPIfClause(pOVar5,user_defined_modifier_local._4_4_);
    local_40 = pOVar5;
    if (user_defined_modifier_local._4_4_ == OMPC_IF_MODIFIER_user) {
      setUserDefinedModifier(pOVar5,(char *)all_clauses);
    }
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back
              ((vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)new_clause,
               (value_type *)&local_40);
  }
  return &local_40->super_OpenMPClause;
}

Assistant:

OpenMPClause* OpenMPIfClause::addIfClause(OpenMPDirective *directive, OpenMPIfClauseModifier modifier, char * user_defined_modifier) {

    std::map<OpenMPClauseKind, std::vector<OpenMPClause*>* >* all_clauses = directive->getAllClauses();
    std::vector<OpenMPClause*>* current_clauses = directive->getClauses(OMPC_if);
    OpenMPClause* new_clause = NULL;

    if (current_clauses->size() == 0) {
        new_clause = new OpenMPIfClause(modifier);
        if (modifier == OMPC_IF_MODIFIER_user) {
            ((OpenMPIfClause*)new_clause)->setUserDefinedModifier(user_defined_modifier);
        };
        current_clauses = new std::vector<OpenMPClause*>();
        current_clauses->push_back(new_clause);
        (*all_clauses)[OMPC_if] = current_clauses;
    } else {
        for (std::vector<OpenMPClause*>::iterator it = current_clauses->begin(); it != current_clauses->end(); ++it) {
            std::string current_user_defined_modifier_expression;
            if (user_defined_modifier) {
                current_user_defined_modifier_expression = std::string(user_defined_modifier);
            };
            if (((OpenMPIfClause*)(*it))->getModifier() == modifier &&
                current_user_defined_modifier_expression.compare(((OpenMPIfClause*)(*it))->getUserDefinedModifier()) == 0) {
                new_clause = (*it);
                return new_clause;
            };
        };
        new_clause = new OpenMPIfClause(modifier);
        if (modifier == OMPC_IF_MODIFIER_user) {
            ((OpenMPIfClause*)new_clause)->setUserDefinedModifier(user_defined_modifier);
        }
        current_clauses->push_back(new_clause);
    }
    return new_clause;
}